

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

Ssw_Sml_t * Ssw_SmlSimulateComb(Aig_Man_t *pAig,int nWords)

{
  Ssw_Sml_t *p;
  
  p = Ssw_SmlStart(pAig,0,1,nWords);
  Ssw_SmlInitialize(p,0);
  Ssw_SmlSimulateOne(p);
  return p;
}

Assistant:

Ssw_Sml_t * Ssw_SmlSimulateComb( Aig_Man_t * pAig, int nWords )
{
    Ssw_Sml_t * p;
    p = Ssw_SmlStart( pAig, 0, 1, nWords );
    Ssw_SmlInitialize( p, 0 );
    Ssw_SmlSimulateOne( p );
    return p;
}